

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int FreeEXRImage(EXRImage *exrImage)

{
  char **__ptr;
  int i_1;
  int i;
  int iVar1;
  long lVar2;
  EXRImage *pEVar3;
  
  if (exrImage == (EXRImage *)0x0) {
    iVar1 = -1;
  }
  else {
    for (lVar2 = 0; __ptr = exrImage->channel_names, lVar2 < exrImage->num_channels;
        lVar2 = lVar2 + 1) {
      if (__ptr != (char **)0x0) {
        free(__ptr[lVar2]);
      }
      if (exrImage->images != (uchar **)0x0) {
        free(exrImage->images[lVar2]);
      }
    }
    free(__ptr);
    free(exrImage->images);
    free(exrImage->pixel_types);
    free(exrImage->requested_pixel_types);
    iVar1 = 0;
    pEVar3 = exrImage;
    for (lVar2 = 0; lVar2 < exrImage->num_custom_attributes; lVar2 = lVar2 + 1) {
      free(pEVar3->custom_attributes[0].name);
      free(pEVar3->custom_attributes[0].type);
      free(pEVar3->custom_attributes[0].value);
      pEVar3 = (EXRImage *)(pEVar3->custom_attributes + 1);
    }
  }
  return iVar1;
}

Assistant:

int FreeEXRImage(EXRImage *exrImage) {

  if (exrImage == NULL) {
    return -1; // Err
  }

  for (int i = 0; i < exrImage->num_channels; i++) {

    if (exrImage->channel_names && exrImage->channel_names[i]) {
      free((char *)exrImage->channel_names[i]); // remove const
    }

    if (exrImage->images && exrImage->images[i]) {
      free(exrImage->images[i]);
    }
  }

  if (exrImage->channel_names) {
    free(exrImage->channel_names);
  }

  if (exrImage->images) {
    free(exrImage->images);
  }

  if (exrImage->pixel_types) {
    free(exrImage->pixel_types);
  }

  if (exrImage->requested_pixel_types) {
    free(exrImage->requested_pixel_types);
  }

  for (int i = 0; i < exrImage->num_custom_attributes; i++) {
    if (exrImage->custom_attributes[i].name) {
      free(exrImage->custom_attributes[i].name);
    }
    if (exrImage->custom_attributes[i].type) {
      free(exrImage->custom_attributes[i].type);
    }
    if (exrImage->custom_attributes[i].value) {
      free(exrImage->custom_attributes[i].value);
    }
  }

  return 0;
}